

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O2

void ncnn::dynamic_quantize_2d(Mat *blob,Mat *blob_int8,float *scale,Option *opt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  void *pvVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int j;
  ulong uVar15;
  float fVar16;
  float fVar17;
  
  Mat::create(blob_int8,blob->w,blob->h,1,1,opt->workspace_allocator);
  uVar5 = blob_int8->w;
  uVar7 = blob_int8->h;
  pvVar8 = blob->data;
  uVar11 = 0;
  uVar13 = 0;
  if (0 < (int)uVar5) {
    uVar13 = (ulong)uVar5;
  }
  uVar14 = 0;
  if (0 < (int)uVar7) {
    uVar14 = (ulong)uVar7;
  }
  fVar16 = 0.0;
  for (; uVar11 != uVar14; uVar11 = uVar11 + 1) {
    for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
      fVar17 = ABS(*(float *)((long)pvVar8 + uVar15 * 4));
      if (fVar16 <= fVar17) {
        fVar16 = fVar17;
      }
    }
    pvVar8 = (void *)((long)pvVar8 + (long)blob->w * blob->elemsize);
  }
  *scale = (float)(-(uint)(fVar16 == 0.0) & 0x3f800000 |
                  ~-(uint)(fVar16 == 0.0) & (uint)(127.0 / fVar16));
  for (lVar12 = 0; lVar12 < (int)uVar7; lVar12 = lVar12 + 1) {
    iVar1 = blob->w;
    lVar9 = (long)(int)uVar5;
    sVar2 = blob_int8->elemsize;
    pvVar8 = blob_int8->data;
    sVar3 = blob->elemsize;
    pvVar4 = blob->data;
    for (lVar10 = 0; lVar10 < (int)uVar5; lVar10 = lVar10 + 1) {
      fVar16 = roundf(*scale * *(float *)((long)pvVar4 + lVar10 * 4 + sVar3 * lVar12 * (long)iVar1))
      ;
      iVar6 = (int)fVar16;
      if (iVar6 < -0x7e) {
        iVar6 = -0x7f;
      }
      if (0x7e < iVar6) {
        iVar6 = 0x7f;
      }
      *(char *)((long)pvVar8 + lVar10 + sVar2 * lVar12 * lVar9) = (char)iVar6;
      uVar5 = blob_int8->w;
    }
    uVar7 = blob_int8->h;
  }
  return;
}

Assistant:

static void dynamic_quantize_2d(const Mat& blob, Mat& blob_int8, float& scale, const Option& opt)
{
    blob_int8.create(blob.w, blob.h, (size_t)1u, 1, opt.workspace_allocator);

    float absmax = 0.f;
    for (int i = 0; i < blob_int8.h; i++)
    {
        const float* ptr = blob.row(i);

        for (int j = 0; j < blob_int8.w; j++)
        {
            absmax = std::max(absmax, (float)fabs(ptr[j]));
        }
    }

    scale = absmax == 0.f ? 1.f : 127.f / absmax;

    for (int i = 0; i < blob_int8.h; i++)
    {
        const float* ptr = blob.row(i);
        signed char* outptr = blob_int8.row<signed char>(i);

        for (int j = 0; j < blob_int8.w; j++)
        {
            outptr[j] = float2int8(ptr[j] * scale);
        }
    }
}